

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall
CGameClient::EvolveCharacter(CGameClient *this,CNetObj_Character *pCharacter,int Tick)

{
  long lVar1;
  CCollision *pCollision;
  int in_EDX;
  CCharacterCore *in_RSI;
  CGameClient *in_RDI;
  long in_FS_OFFSET;
  CCharacterCore TempCore;
  CWorldCore TempWorld;
  undefined4 in_stack_fffffffffffffce0;
  vec2 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd9f;
  CCharacterCore *in_stack_fffffffffffffda0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CWorldCore::CWorldCore((CWorldCore *)CONCAT44(in_EDX,in_stack_fffffffffffffce0));
  CCharacterCore::CCharacterCore((CCharacterCore *)CONCAT44(in_EDX,in_stack_fffffffffffffce0));
  mem_zero((void *)CONCAT44(in_EDX,in_stack_fffffffffffffce0),(uint)((ulong)in_RDI >> 0x20));
  pCollision = Collision(in_RDI);
  CCharacterCore::Init
            ((CCharacterCore *)&stack0xfffffffffffffcf8,(CWorldCore *)&stack0xfffffffffffffd78,
             pCollision);
  CCharacterCore::Read((CCharacterCore *)&stack0xfffffffffffffcf8,(CNetObj_CharacterCore *)in_RSI);
  while (*(int *)&in_RSI->m_pWorld < in_EDX) {
    *(int *)&in_RSI->m_pWorld = *(int *)&in_RSI->m_pWorld + 1;
    CCharacterCore::Tick(in_stack_fffffffffffffda0,(bool)in_stack_fffffffffffffd9f);
    CCharacterCore::Move((CCharacterCore *)in_stack_fffffffffffffd28);
    CCharacterCore::Quantize(in_RSI);
  }
  CCharacterCore::Write
            ((CCharacterCore *)CONCAT44(in_EDX,in_stack_fffffffffffffce0),
             (CNetObj_CharacterCore *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::EvolveCharacter(CNetObj_Character *pCharacter, int Tick)
{
	CWorldCore TempWorld;
	CCharacterCore TempCore;
	mem_zero(&TempCore, sizeof(TempCore));
	TempCore.Init(&TempWorld, Collision());
	TempCore.Read(pCharacter);

	while(pCharacter->m_Tick < Tick)
	{
		pCharacter->m_Tick++;
		TempCore.Tick(false);
		TempCore.Move();
		TempCore.Quantize();
	}

	TempCore.Write(pCharacter);
}